

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  ostream *poVar4;
  cmTargetInternals *pcVar5;
  TargetPropertyEntry *pTVar6;
  auto_ptr<cmCompiledGeneratorExpression> local_920;
  TargetPropertyEntry *local_918;
  cmGeneratorExpression local_910;
  cmCompiledGeneratorExpression *local_908;
  auto_ptr<cmCompiledGeneratorExpression> local_900;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge_4;
  cmListFileBacktrace lfbt_5;
  ostringstream local_8a0 [8];
  ostringstream e_3;
  allocator local_721;
  string local_720;
  undefined1 local_700 [8];
  cmValueWithOrigin entry;
  cmListFileBacktrace lfbt_4;
  ostringstream local_660 [8];
  ostringstream e_2;
  cmGeneratorExpression local_4e0;
  cmCompiledGeneratorExpression *local_4d8;
  auto_ptr<cmCompiledGeneratorExpression> local_4d0;
  TargetPropertyEntry *local_4c8;
  cmGeneratorExpression local_4c0;
  cmGeneratorExpression ge_3;
  cmListFileBacktrace lfbt_3;
  cmGeneratorExpression local_480;
  cmCompiledGeneratorExpression *local_478;
  auto_ptr<cmCompiledGeneratorExpression> local_470;
  TargetPropertyEntry *local_468;
  cmGeneratorExpression local_460;
  cmGeneratorExpression ge_2;
  cmListFileBacktrace lfbt_2;
  cmGeneratorExpression local_420;
  cmCompiledGeneratorExpression *local_418;
  auto_ptr<cmCompiledGeneratorExpression> local_410;
  TargetPropertyEntry *local_408;
  cmGeneratorExpression local_400;
  cmGeneratorExpression ge_1;
  cmListFileBacktrace lfbt_1;
  cmGeneratorExpression local_3c0;
  cmCompiledGeneratorExpression *local_3b8;
  auto_ptr<cmCompiledGeneratorExpression> local_3b0;
  TargetPropertyEntry *local_3a8;
  cmGeneratorExpression local_3a0;
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  ostringstream local_348 [8];
  ostringstream e_1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  bool asString_local;
  char *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  TVar3 = GetType(this);
  if ((TVar3 != INTERFACE_LIBRARY) || (bVar2 = whiteListedInterfaceProperty(prop), bVar2)) {
    bVar2 = std::operator==(prop,"NAME");
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream(local_348);
      std::operator<<((ostream *)local_348,"NAME property is read-only\n");
      pcVar1 = this->Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&lfbt.Snapshot.Position.Position);
      std::__cxx11::string::~string((string *)&lfbt.Snapshot.Position.Position);
      std::__cxx11::ostringstream::~ostringstream(local_348);
    }
    else {
      bVar2 = std::operator==(prop,"INCLUDE_DIRECTORIES");
      if (bVar2) {
        cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge,this->Makefile);
        cmGeneratorExpression::cmGeneratorExpression(&local_3a0,(cmListFileBacktrace *)&ge);
        pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
        pTVar6 = (TargetPropertyEntry *)operator_new(0x10);
        cmGeneratorExpression::Parse(&local_3c0,(char *)&local_3a0);
        local_3b8 = (cmCompiledGeneratorExpression *)
                    cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_3c0);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                  (&local_3b0,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_3b8);
        cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
                  (pTVar6,&local_3b0,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
        local_3a8 = pTVar6;
        std::
        vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ::push_back(&pcVar5->IncludeDirectoriesEntries,&local_3a8);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_3b0);
        cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                  ((auto_ptr<cmCompiledGeneratorExpression> *)&local_3c0);
        cmGeneratorExpression::~cmGeneratorExpression(&local_3a0);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge);
      }
      else {
        bVar2 = std::operator==(prop,"COMPILE_OPTIONS");
        if (bVar2) {
          cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge_1,this->Makefile);
          cmGeneratorExpression::cmGeneratorExpression(&local_400,(cmListFileBacktrace *)&ge_1);
          pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
          pTVar6 = (TargetPropertyEntry *)operator_new(0x10);
          cmGeneratorExpression::Parse(&local_420,(char *)&local_400);
          local_418 = (cmCompiledGeneratorExpression *)
                      cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_420);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                    (&local_410,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_418);
          cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
                    (pTVar6,&local_410,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
          local_408 = pTVar6;
          std::
          vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          ::push_back(&pcVar5->CompileOptionsEntries,&local_408);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_410);
          cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                    ((auto_ptr<cmCompiledGeneratorExpression> *)&local_420);
          cmGeneratorExpression::~cmGeneratorExpression(&local_400);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge_1);
        }
        else {
          bVar2 = std::operator==(prop,"COMPILE_FEATURES");
          if (bVar2) {
            cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge_2,this->Makefile);
            cmGeneratorExpression::cmGeneratorExpression(&local_460,(cmListFileBacktrace *)&ge_2);
            pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
            pTVar6 = (TargetPropertyEntry *)operator_new(0x10);
            cmGeneratorExpression::Parse(&local_480,(char *)&local_460);
            local_478 = (cmCompiledGeneratorExpression *)
                        cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_480);
            cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                      (&local_470,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_478);
            cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
                      (pTVar6,&local_470,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
            local_468 = pTVar6;
            std::
            vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            ::push_back(&pcVar5->CompileFeaturesEntries,&local_468);
            cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_470);
            cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                      ((auto_ptr<cmCompiledGeneratorExpression> *)&local_480);
            cmGeneratorExpression::~cmGeneratorExpression(&local_460);
            cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge_2);
          }
          else {
            bVar2 = std::operator==(prop,"COMPILE_DEFINITIONS");
            if (bVar2) {
              cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge_3,this->Makefile);
              cmGeneratorExpression::cmGeneratorExpression(&local_4c0,(cmListFileBacktrace *)&ge_3);
              pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
              pTVar6 = (TargetPropertyEntry *)operator_new(0x10);
              cmGeneratorExpression::Parse(&local_4e0,(char *)&local_4c0);
              local_4d8 = (cmCompiledGeneratorExpression *)
                          cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_4e0);
              cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                        (&local_4d0,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_4d8);
              cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
                        (pTVar6,&local_4d0,&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
              local_4c8 = pTVar6;
              std::
              vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              ::push_back(&pcVar5->CompileDefinitionsEntries,&local_4c8);
              cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_4d0);
              cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                        ((auto_ptr<cmCompiledGeneratorExpression> *)&local_4e0);
              cmGeneratorExpression::~cmGeneratorExpression(&local_4c0);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge_3);
            }
            else {
              bVar2 = std::operator==(prop,"EXPORT_NAME");
              if ((bVar2) && (bVar2 = IsImported(this), bVar2)) {
                std::__cxx11::ostringstream::ostringstream(local_660);
                poVar4 = std::operator<<((ostream *)local_660,
                                         "EXPORT_NAME property can\'t be set on imported targets (\""
                                        );
                poVar4 = std::operator<<(poVar4,(string *)&this->Name);
                std::operator<<(poVar4,"\")\n");
                pcVar1 = this->Makefile;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage
                          (pcVar1,FATAL_ERROR,(string *)&lfbt_4.Snapshot.Position.Position);
                std::__cxx11::string::~string((string *)&lfbt_4.Snapshot.Position.Position);
                std::__cxx11::ostringstream::~ostringstream(local_660);
              }
              else {
                bVar2 = std::operator==(prop,"LINK_LIBRARIES");
                if (bVar2) {
                  cmMakefile::GetBacktrace
                            ((cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position,
                             this->Makefile);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_720,value,&local_721);
                  cmValueWithOrigin::cmValueWithOrigin
                            ((cmValueWithOrigin *)local_700,&local_720,
                             (cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position);
                  std::__cxx11::string::~string((string *)&local_720);
                  std::allocator<char>::~allocator((allocator<char> *)&local_721);
                  pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                  std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                            (&pcVar5->LinkImplementationPropertyEntries,(value_type *)local_700);
                  cmValueWithOrigin::~cmValueWithOrigin((cmValueWithOrigin *)local_700);
                  cmListFileBacktrace::~cmListFileBacktrace
                            ((cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position);
                }
                else {
                  bVar2 = std::operator==(prop,"SOURCES");
                  if (bVar2) {
                    bVar2 = IsImported(this);
                    if (bVar2) {
                      std::__cxx11::ostringstream::ostringstream(local_8a0);
                      poVar4 = std::operator<<((ostream *)local_8a0,
                                               "SOURCES property can\'t be set on imported targets (\""
                                              );
                      poVar4 = std::operator<<(poVar4,(string *)&this->Name);
                      std::operator<<(poVar4,"\")\n");
                      pcVar1 = this->Makefile;
                      std::__cxx11::ostringstream::str();
                      cmMakefile::IssueMessage
                                (pcVar1,FATAL_ERROR,(string *)&lfbt_5.Snapshot.Position.Position);
                      std::__cxx11::string::~string((string *)&lfbt_5.Snapshot.Position.Position);
                      std::__cxx11::ostringstream::~ostringstream(local_8a0);
                    }
                    else {
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
                      ::clear(&pcVar5->SourceFilesMap);
                      cmMakefile::GetBacktrace((cmListFileBacktrace *)&ge_4,this->Makefile);
                      cmGeneratorExpression::cmGeneratorExpression
                                ((cmGeneratorExpression *)&cge,(cmListFileBacktrace *)&ge_4);
                      cmGeneratorExpression::Parse(&local_910,(char *)&cge);
                      local_908 = (cmCompiledGeneratorExpression *)
                                  cmsys::auto_ptr::operator_cast_to_auto_ptr_ref
                                            ((auto_ptr *)&local_910);
                      cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                                (&local_900,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_908);
                      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                                ((auto_ptr<cmCompiledGeneratorExpression> *)&local_910);
                      pcVar5 = cmTargetInternalPointer::operator->(&this->Internal);
                      pTVar6 = (TargetPropertyEntry *)operator_new(0x10);
                      cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
                                (&local_920,&local_900);
                      cmTargetInternals::TargetPropertyEntry::TargetPropertyEntry
                                (pTVar6,&local_920,
                                 &cmTargetInternals::TargetPropertyEntry::NoLinkImplItem);
                      local_918 = pTVar6;
                      std::
                      vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                      ::push_back(&pcVar5->SourceEntries,&local_918);
                      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_920);
                      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_900);
                      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
                      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge_4);
                    }
                  }
                  else {
                    cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
                    MaybeInvalidatePropertyCache(this,prop);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar4 = std::operator<<((ostream *)local_1a0,
                             "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                            );
    poVar4 = std::operator<<(poVar4,(string *)prop);
    std::operator<<(poVar4,"\" is not allowed.");
    pcVar1 = this->Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (this->GetType() == INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if (prop == "NAME")
    {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if(prop == "INCLUDE_DIRECTORIES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->IncludeDirectoriesEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "COMPILE_OPTIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->CompileOptionsEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "COMPILE_FEATURES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->CompileFeaturesEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "COMPILE_DEFINITIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->CompileDefinitionsEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "EXPORT_NAME" && this->IsImported())
    {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
          << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  else if (prop == "LINK_LIBRARIES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmValueWithOrigin entry(value, lfbt);
    this->Internal->LinkImplementationPropertyEntries.push_back(entry);
    }
  else if (prop == "SOURCES")
    {
    if(this->IsImported())
      {
      std::ostringstream e;
      e << "SOURCES property can't be set on imported targets (\""
            << this->Name << "\")\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
      this->Internal->SourceFilesMap.clear();
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      cmGeneratorExpression ge(&lfbt);
      cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
      this->Internal->SourceEntries.push_back(
                            new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else
    {
    this->Properties.AppendProperty(prop, value, asString);
    this->MaybeInvalidatePropertyCache(prop);
    }
}